

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall FIX::double_conversion::Bignum::Square(Bignum *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  uint *puVar6;
  bool bVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  
  bVar7 = IsClamped(this);
  if (!bVar7) {
    __assert_fail("IsClamped()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x155,"void FIX::double_conversion::Bignum::Square()");
  }
  uVar1 = this->used_digits_;
  uVar13 = (ulong)uVar1;
  if (0x40 < (int)uVar1) {
    abort();
  }
  if (0 < this->used_digits_) {
    puVar5 = (this->bigits_).start_;
    lVar10 = 0;
    do {
      iVar2 = (this->bigits_).length_;
      if (((iVar2 <= lVar10) || (iVar11 = uVar1 + (int)lVar10, iVar11 < 0)) || (iVar2 <= iVar11))
      goto LAB_00166886;
      puVar5[uVar13 + lVar10] = puVar5[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->used_digits_);
  }
  uVar9 = this->used_digits_;
  if ((int)uVar9 < 1) {
    uVar8 = 0;
  }
  else {
    puVar5 = (this->bigits_).start_;
    lVar10 = 0;
    uVar8 = 0;
    uVar12 = uVar1;
    do {
      iVar2 = (this->bigits_).length_;
      puVar6 = (this->bigits_).start_;
      uVar14 = uVar13;
      lVar16 = lVar10;
      do {
        if ((((int)(uVar13 + lVar16) < 0) || (iVar2 <= (int)uVar12)) ||
           (((int)uVar14 < 0 || (iVar2 <= (int)uVar14)))) goto LAB_00166886;
        uVar8 = uVar8 + (ulong)puVar6[uVar14] * (ulong)puVar6[uVar13 + lVar16 & 0xffffffff];
        uVar14 = uVar14 + 1;
        bVar7 = lVar16 != 0;
        lVar16 = lVar16 + -1;
      } while (bVar7);
      if ((this->bigits_).length_ <= lVar10) goto LAB_00166886;
      puVar5[lVar10] = (uint)uVar8 & 0xfffffff;
      uVar8 = uVar8 >> 0x1c;
      lVar10 = lVar10 + 1;
      uVar9 = this->used_digits_;
      uVar12 = uVar12 + 1;
    } while (lVar10 < (int)uVar9);
  }
  iVar2 = uVar1 * 2;
  if ((int)uVar9 < iVar2) {
    puVar5 = (this->bigits_).start_;
    uVar13 = (ulong)uVar9;
    iVar11 = uVar1 + uVar9;
    do {
      iVar11 = iVar11 + 1;
      iVar3 = this->used_digits_;
      iVar15 = ((int)uVar13 - iVar3) + 1;
      if (iVar15 < iVar3) {
        iVar4 = (this->bigits_).length_;
        puVar6 = (this->bigits_).start_;
        uVar12 = (uVar1 - 1) + iVar3;
        uVar14 = (ulong)(uint)(iVar11 - iVar3);
        uVar17 = uVar12;
        do {
          if ((((int)uVar17 < 0) || (iVar4 <= (int)uVar12)) ||
             (((int)uVar14 < 0 || (iVar4 <= (int)uVar14)))) goto LAB_00166886;
          uVar8 = uVar8 + (ulong)puVar6[uVar14] * (ulong)puVar6[uVar17];
          iVar15 = iVar15 + 1;
          uVar14 = uVar14 + 1;
          uVar17 = uVar17 - 1;
        } while (iVar15 < iVar3);
      }
      if (((int)uVar9 < 0) || ((this->bigits_).length_ <= (int)uVar13)) {
LAB_00166886:
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xca,
                      "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                     );
      }
      puVar5[uVar13] = (uint)uVar8 & 0xfffffff;
      uVar8 = uVar8 >> 0x1c;
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < iVar2);
  }
  if (uVar8 != 0) {
    __assert_fail("accumulator == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x193,"void FIX::double_conversion::Bignum::Square()");
  }
  this->used_digits_ = iVar2;
  this->exponent_ = this->exponent_ << 1;
  Clamp(this);
  return;
}

Assistant:

void Bignum::Square() {
  ASSERT(IsClamped());
  int product_length = 2 * used_digits_;
  EnsureCapacity(product_length);

  // Comba multiplication: compute each column separately.
  // Example: r = a2a1a0 * b2b1b0.
  //    r =  1    * a0b0 +
  //        10    * (a1b0 + a0b1) +
  //        100   * (a2b0 + a1b1 + a0b2) +
  //        1000  * (a2b1 + a1b2) +
  //        10000 * a2b2
  //
  // In the worst case we have to accumulate nb-digits products of digit*digit.
  //
  // Assert that the additional number of bits in a DoubleChunk are enough to
  // sum up used_digits of Bigit*Bigit.
  if ((1 << (2 * (kChunkSize - kBigitSize))) <= used_digits_) {
    UNIMPLEMENTED();
  }
  DoubleChunk accumulator = 0;
  // First shift the digits so we don't overwrite them.
  int copy_offset = used_digits_;
  for (int i = 0; i < used_digits_; ++i) {
    bigits_[copy_offset + i] = bigits_[i];
  }
  // We have two loops to avoid some 'if's in the loop.
  for (int i = 0; i < used_digits_; ++i) {
    // Process temporary digit i with power i.
    // The sum of the two indices must be equal to i.
    int bigit_index1 = i;
    int bigit_index2 = 0;
    // Sum all of the sub-products.
    while (bigit_index1 >= 0) {
      Chunk chunk1 = bigits_[copy_offset + bigit_index1];
      Chunk chunk2 = bigits_[copy_offset + bigit_index2];
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    bigits_[i] = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  for (int i = used_digits_; i < product_length; ++i) {
    int bigit_index1 = used_digits_ - 1;
    int bigit_index2 = i - bigit_index1;
    // Invariant: sum of both indices is again equal to i.
    // Inner loop runs 0 times on last iteration, emptying accumulator.
    while (bigit_index2 < used_digits_) {
      Chunk chunk1 = bigits_[copy_offset + bigit_index1];
      Chunk chunk2 = bigits_[copy_offset + bigit_index2];
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    // The overwritten bigits_[i] will never be read in further loop iterations,
    // because bigit_index1 and bigit_index2 are always greater
    // than i - used_digits_.
    bigits_[i] = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  // Since the result was guaranteed to lie inside the number the
  // accumulator must be 0 now.
  ASSERT(accumulator == 0);

  // Don't forget to update the used_digits and the exponent.
  used_digits_ = product_length;
  exponent_ *= 2;
  Clamp();
}